

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prettyprint.cc
# Opt level: O0

void __thiscall EmitPrettyPrint::advanceleft(EmitPrettyPrint *this)

{
  bool bVar1;
  printclass pVar2;
  int4 iVar3;
  TokenSplit *pTVar4;
  TokenSplit *tok;
  int4 l;
  EmitPrettyPrint *this_local;
  
  pTVar4 = circularqueue<TokenSplit>::bottom(&this->tokqueue);
  tok._4_4_ = TokenSplit::getSize(pTVar4);
  while( true ) {
    if (tok._4_4_ < 0) {
      return;
    }
    pTVar4 = circularqueue<TokenSplit>::bottom(&this->tokqueue);
    print(this,pTVar4);
    pVar2 = TokenSplit::getClass(pTVar4);
    if (pVar2 == tokenstring) {
      this->leftotal = tok._4_4_ + this->leftotal;
    }
    else if (pVar2 == tokenbreak) {
      iVar3 = TokenSplit::getNumSpaces(pTVar4);
      this->leftotal = iVar3 + this->leftotal;
    }
    circularqueue<TokenSplit>::popbottom(&this->tokqueue);
    bVar1 = circularqueue<TokenSplit>::empty(&this->tokqueue);
    if (bVar1) break;
    pTVar4 = circularqueue<TokenSplit>::bottom(&this->tokqueue);
    tok._4_4_ = TokenSplit::getSize(pTVar4);
  }
  return;
}

Assistant:

void EmitPrettyPrint::advanceleft(void)

{
  int4 l = tokqueue.bottom().getSize();
  while(l >= 0) {
    const TokenSplit &tok( tokqueue.bottom() );
    print(tok);
    switch(tok.getClass()) {
    case TokenSplit::tokenbreak:
      leftotal += tok.getNumSpaces();
      break;
    case TokenSplit::tokenstring:
      leftotal += l;
      break;
    default:
      break;
    }
    tokqueue.popbottom();
    if (tokqueue.empty()) break;
    l = tokqueue.bottom().getSize();
  }
}